

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::SReadMemTask::~SReadMemTask(SReadMemTask *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~SReadMemTask((SReadMemTask *)0x99bdc8);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

SReadMemTask(KnownSystemName knownNameId) : SystemTaskBase(knownNameId) {
        hasOutputArgs = true;
    }